

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O1

_Bool coll_tmap_contains_value(coll_tmap_t *map,void *value)

{
  coll_tmap_entry_t *pcVar1;
  coll_tmap_entry_t *pcVar2;
  coll_tmap_entry_t *pcVar3;
  bool bVar4;
  
  pcVar1 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
    pcVar2 = (coll_tmap_entry_t *)0x0;
  }
  else {
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2->left;
    } while (pcVar2->left != (coll_tmap_entry_t *)0x0);
  }
  do {
    while( true ) {
      if ((pcVar2 == (coll_tmap_entry_t *)0x0) || (pcVar2->val == value)) {
        return pcVar2 != (coll_tmap_entry_t *)0x0;
      }
      pcVar1 = pcVar2->right;
      pcVar3 = pcVar2;
      if (pcVar2->right == (coll_tmap_entry_t *)0x0) break;
      do {
        pcVar2 = pcVar1;
        pcVar1 = pcVar2->left;
      } while (pcVar2->left != (coll_tmap_entry_t *)0x0);
    }
    do {
      pcVar2 = pcVar3->parent;
      if (pcVar2 == (coll_tmap_entry_t *)0x0) break;
      bVar4 = pcVar2->right == pcVar3;
      pcVar3 = pcVar2;
    } while (bVar4);
  } while( true );
}

Assistant:

bool coll_tmap_contains_value(coll_tmap_t *map, void *value) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        if (cur->val == value) {
            return true;
        }
        cur = entry_next(cur);
    }
    return false;
}